

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_lbd_create_cumulative_image.cpp
# Opt level: O1

void print_usage(FILE *stream,char **argv)

{
  fprintf((FILE *)stream,"Usage: %s ",*argv);
  fwrite("[--lbd=freak|brief|rfreak|exfreak] ",0x23,1,(FILE *)stream);
  fwrite("[-n normalize=0] ",0x11,1,(FILE *)stream);
  fwrite("[-p psize=32] ",0xe,1,(FILE *)stream);
  fwrite("[-m M=512 ] ",0xc,1,(FILE *)stream);
  fwrite("result_image\n",0xd,1,(FILE *)stream);
  return;
}

Assistant:

void print_usage(FILE *stream, char **argv)
{
  fprintf(stream, "Usage: %s ", argv[0]);
  fprintf(stream, "[--lbd=freak|brief|rfreak|exfreak] ");  
  fprintf(stream, "[-n normalize=0] ");
  fprintf(stream, "[-p psize=32] ");
  fprintf(stream, "[-m M=512 ] ");
  fprintf(stream, "result_image\n");
}